

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  cmMakefile *pcVar1;
  string_view str;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  cmListFileContext *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_00;
  string *psVar6;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  cmValue local_130;
  cmValue value;
  cmAlphaNum local_108;
  string_view local_d8;
  string_view local_c8;
  cmAlphaNum local_b8;
  string local_88;
  undefined1 local_58 [24];
  cmListFileContext *top;
  string line;
  char *var_local;
  cmCommandArgumentParserHelper *this_local;
  
  if (var == (char *)0x0) {
    this_local = (cmCommandArgumentParserHelper *)0x0;
  }
  else {
    line.field_2._8_8_ = var;
    if ((this->FileLine < 0) || (iVar4 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar4 != 0)) {
      uVar2 = line.field_2._8_8_;
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,(char *)uVar2,&local_151);
      local_130 = cmMakefile::GetDefinition(pcVar1,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
      bVar3 = cmValue::operator_cast_to_bool(&local_130);
      uVar2 = line.field_2._8_8_;
      if (!bVar3) {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,(char *)uVar2,&local_179);
        cmMakefile::MaybeWarnUninitialized(pcVar1,&local_178,this->FileName);
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator(&local_179);
        if ((this->RemoveEmpty & 1U) == 0) {
          return (char *)0x0;
        }
      }
      if (((this->EscapeQuotes & 1U) == 0) ||
         (bVar3 = cmValue::operator_cast_to_bool(&local_130), !bVar3)) {
        psVar6 = cmValue::operator_cast_to_string_(&local_130);
        this_local = (cmCommandArgumentParserHelper *)AddString(this,psVar6);
      }
      else {
        psVar6 = cmValue::operator*[abi_cxx11_(&local_130);
        str = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
        cmEscapeQuotes_abi_cxx11_(&local_1a0,str);
        this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
      }
    }
    else {
      std::__cxx11::string::string((string *)&top);
      cmMakefile::GetBacktrace((cmMakefile *)local_58);
      pcVar5 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                         ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_58);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_58);
      local_58._16_8_ = pcVar5;
      bVar3 = std::optional::operator_cast_to_bool((optional *)&pcVar5->DeferId);
      if (bVar3) {
        local_d8 = (string_view)::cm::operator____s("DEFERRED:",9);
        local_c8 = local_d8;
        cmAlphaNum::cmAlphaNum(&local_b8,local_d8);
        str_00 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)(local_58._16_8_ + 0x48));
        cmAlphaNum::cmAlphaNum(&local_108,str_00);
        cmStrCat<>(&local_88,&local_b8,&local_108);
        std::__cxx11::string::operator=((string *)&top,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
      else {
        std::__cxx11::to_string((string *)&value,this->FileLine);
        std::__cxx11::string::operator=((string *)&top,(string *)&value);
        std::__cxx11::string::~string((string *)&value);
      }
      this_local = (cmCommandArgumentParserHelper *)AddString(this,(string *)&top);
      std::__cxx11::string::~string((string *)&top);
    }
  }
  return (char *)this_local;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if (!var) {
    return nullptr;
  }
  if (this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0) {
    std::string line;
    cmListFileContext const& top = this->Makefile->GetBacktrace().Top();
    if (top.DeferId) {
      line = cmStrCat("DEFERRED:"_s, *top.DeferId);
    } else {
      line = std::to_string(this->FileLine);
    }
    return this->AddString(line);
  }
  cmValue value = this->Makefile->GetDefinition(var);
  if (!value) {
    this->Makefile->MaybeWarnUninitialized(var, this->FileName);
    if (!this->RemoveEmpty) {
      return nullptr;
    }
  }
  if (this->EscapeQuotes && value) {
    return this->AddString(cmEscapeQuotes(*value));
  }
  return this->AddString(value);
}